

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_mutex_init(uv_mutex_t *mutex)

{
  int iVar1;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)mutex,(pthread_mutexattr_t *)0x0);
  return -iVar1;
}

Assistant:

int uv_mutex_init(uv_mutex_t* mutex) {
#if defined(NDEBUG) || !defined(PTHREAD_MUTEX_ERRORCHECK)
  return UV__ERR(pthread_mutex_init(mutex, NULL));
#else
  pthread_mutexattr_t attr;
  int err;

  if (pthread_mutexattr_init(&attr))
    abort();

  if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_ERRORCHECK))
    abort();

  err = pthread_mutex_init(mutex, &attr);

  if (pthread_mutexattr_destroy(&attr))
    abort();

  return UV__ERR(err);
#endif
}